

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

ebur128_state * ebur128_init(uint channels,unsigned_long samplerate,int mode)

{
  int iVar1;
  ebur128_state *st;
  ebur128_state_internal *__ptr;
  double *pdVar2;
  double *__ptr_00;
  double *__ptr_01;
  double *__ptr_02;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  unsigned_long *__ptr_03;
  unsigned_long *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  double dVar11;
  
  if (samplerate - 0x2b1101 < 0xffffffffffd4ef0f || channels - 0x41 < 0xffffffc0) {
    return (ebur128_state *)0x0;
  }
  st = (ebur128_state *)malloc(0x18);
  if (st == (ebur128_state *)0x0) {
    return (ebur128_state *)0x0;
  }
  __ptr = (ebur128_state_internal *)malloc(0x140);
  st->d = __ptr;
  if (__ptr == (ebur128_state_internal *)0x0) goto LAB_00104c0f;
  st->channels = channels;
  iVar1 = ebur128_init_channel_map(st);
  if (iVar1 == 0) {
    uVar3 = (ulong)(channels * 8);
    pdVar2 = (double *)malloc(uVar3);
    __ptr->sample_peak = pdVar2;
    if (pdVar2 != (double *)0x0) {
      __ptr_00 = (double *)malloc(uVar3);
      __ptr->prev_sample_peak = __ptr_00;
      if (__ptr_00 != (double *)0x0) {
        __ptr_01 = (double *)malloc(uVar3);
        __ptr->true_peak = __ptr_01;
        if (__ptr_01 != (double *)0x0) {
          __ptr_02 = (double *)malloc(uVar3);
          __ptr->prev_true_peak = __ptr_02;
          if (__ptr_02 != (double *)0x0) {
            for (uVar3 = 0; channels != uVar3; uVar3 = uVar3 + 1) {
              pdVar2[uVar3] = 0.0;
              __ptr_00[uVar3] = 0.0;
              __ptr_01[uVar3] = 0.0;
              __ptr_02[uVar3] = 0.0;
            }
            __ptr->use_histogram = (uint)mode >> 6 & 1;
            __ptr->history = 0xffffffffffffffff;
            st->samplerate = samplerate;
            uVar3 = (samplerate + 5) / 10;
            __ptr->samples_in_100ms = uVar3;
            st->mode = mode;
            uVar4 = 3000;
            if (((~mode & 3U) == 0) || (uVar4 = 400, (mode & 1U) != 0)) {
              __ptr->window = uVar4;
              uVar5 = (samplerate * uVar4) / 1000;
              uVar8 = uVar5 % uVar3;
              lVar9 = uVar3 - uVar8;
              if (uVar8 == 0) {
                lVar9 = 0;
              }
              sVar10 = lVar9 + uVar5;
              __ptr->audio_data_frames = sVar10;
              lVar9 = sVar10 * channels;
              pdVar2 = (double *)malloc(lVar9 * 8);
              __ptr->audio_data = pdVar2;
              if (pdVar2 != (double *)0x0) {
                for (lVar7 = 0; lVar9 - lVar7 != 0; lVar7 = lVar7 + 1) {
                  pdVar2[lVar7] = 0.0;
                }
                iVar1 = ebur128_init_filter(st);
                if (iVar1 == 0) {
                  if (__ptr->use_histogram == 0) {
                    __ptr->block_energy_histogram = (unsigned_long *)0x0;
                    __ptr->short_term_block_energy_histogram = (unsigned_long *)0x0;
LAB_00104aff:
                    (__ptr->block_list).stqh_first = (ebur128_dq_entry *)0x0;
                    (__ptr->block_list).stqh_last = &(__ptr->block_list).stqh_first;
                    __ptr->block_list_size = 0;
                    (__ptr->short_term_block_list).stqh_first = (ebur128_dq_entry *)0x0;
                    uVar3 = __ptr->history;
                    __ptr->block_list_max = uVar3 / 100;
                    (__ptr->short_term_block_list).stqh_last =
                         &(__ptr->short_term_block_list).stqh_first;
                    __ptr->st_block_list_size = 0;
                    __ptr->st_block_list_max = uVar3 / 3000;
                    __ptr->short_term_frame_counter = 0;
                    iVar1 = ebur128_init_resampler(st);
                    if (iVar1 == 0) {
                      __ptr->needed_frames = __ptr->samples_in_100ms << 2;
                      __ptr->audio_data_index = 0;
                      relative_gate_factor = 0.1;
                      minus_twenty_decibels = 0.01;
                      histogram_energy_boundaries[0] = 1.1724653045822981e-07;
                      if (__ptr->use_histogram != 0) {
                        pdVar2 = histogram_energies;
                        for (lVar9 = 0; lVar9 != 1000; lVar9 = lVar9 + 1) {
                          dVar11 = pow(10.0,((double)(int)lVar9 / 10.0 + -69.95 + 0.691) / 10.0);
                          *pdVar2 = dVar11;
                          pdVar2 = pdVar2 + 1;
                        }
                        for (lVar9 = 1; lVar9 != 0x3e9; lVar9 = lVar9 + 1) {
                          dVar11 = pow(10.0,((double)(int)lVar9 / 10.0 + -70.0 + 0.691) / 10.0);
                          histogram_energy_boundaries[lVar9] = dVar11;
                        }
                        return st;
                      }
                      relative_gate_factor = 0.1;
                      minus_twenty_decibels = 0.01;
                      histogram_energy_boundaries[0] = 1.1724653045822981e-07;
                      return st;
                    }
                    free(__ptr->short_term_block_energy_histogram);
                    __ptr_03 = __ptr->block_energy_histogram;
LAB_00104b9e:
                    free(__ptr_03);
                  }
                  else {
                    __ptr_03 = (unsigned_long *)malloc(8000);
                    __ptr->block_energy_histogram = __ptr_03;
                    if (__ptr_03 != (unsigned_long *)0x0) {
                      for (lVar9 = 0; lVar9 != 1000; lVar9 = lVar9 + 1) {
                        __ptr_03[lVar9] = 0;
                      }
                      puVar6 = (unsigned_long *)malloc(8000);
                      __ptr->short_term_block_energy_histogram = puVar6;
                      if (puVar6 != (unsigned_long *)0x0) {
                        for (lVar9 = 0; lVar9 != 1000; lVar9 = lVar9 + 1) {
                          puVar6[lVar9] = 0;
                        }
                        goto LAB_00104aff;
                      }
                      goto LAB_00104b9e;
                    }
                  }
                  free(__ptr->v);
                }
                free(__ptr->audio_data);
                __ptr_02 = __ptr->prev_true_peak;
              }
            }
            free(__ptr_02);
            __ptr_01 = __ptr->true_peak;
          }
          free(__ptr_01);
          __ptr_00 = __ptr->prev_sample_peak;
        }
        free(__ptr_00);
        pdVar2 = __ptr->sample_peak;
      }
      free(pdVar2);
    }
    free(__ptr->channel_map);
  }
  free(__ptr);
LAB_00104c0f:
  free(st);
  return (ebur128_state *)0x0;
}

Assistant:

ebur128_state*
ebur128_init(unsigned int channels, unsigned long samplerate, int mode) {
  int result;
  int errcode;
  ebur128_state* st;
  unsigned int i;
  size_t j;

  VALIDATE_CHANNELS_AND_SAMPLERATE(NULL);

  st = (ebur128_state*) malloc(sizeof(ebur128_state));
  CHECK_ERROR(!st, 0, exit)
  st->d = (struct ebur128_state_internal*) malloc(
      sizeof(struct ebur128_state_internal));
  CHECK_ERROR(!st->d, 0, free_state)
  st->channels = channels;
  errcode = ebur128_init_channel_map(st);
  CHECK_ERROR(errcode, 0, free_internal)

  st->d->sample_peak = (double*) malloc(channels * sizeof(double));
  CHECK_ERROR(!st->d->sample_peak, 0, free_channel_map)
  st->d->prev_sample_peak = (double*) malloc(channels * sizeof(double));
  CHECK_ERROR(!st->d->prev_sample_peak, 0, free_sample_peak)
  st->d->true_peak = (double*) malloc(channels * sizeof(double));
  CHECK_ERROR(!st->d->true_peak, 0, free_prev_sample_peak)
  st->d->prev_true_peak = (double*) malloc(channels * sizeof(double));
  CHECK_ERROR(!st->d->prev_true_peak, 0, free_true_peak)
  for (i = 0; i < channels; ++i) {
    st->d->sample_peak[i] = 0.0;
    st->d->prev_sample_peak[i] = 0.0;
    st->d->true_peak[i] = 0.0;
    st->d->prev_true_peak[i] = 0.0;
  }

  st->d->use_histogram = mode & EBUR128_MODE_HISTOGRAM ? 1 : 0;
  st->d->history = ULONG_MAX;
  st->samplerate = samplerate;
  st->d->samples_in_100ms = (st->samplerate + 5) / 10;
  st->mode = mode;
  if ((mode & EBUR128_MODE_S) == EBUR128_MODE_S) {
    st->d->window = 3000;
  } else if ((mode & EBUR128_MODE_M) == EBUR128_MODE_M) {
    st->d->window = 400;
  } else {
    goto free_prev_true_peak;
  }
  st->d->audio_data_frames = st->samplerate * st->d->window / 1000;
  if (st->d->audio_data_frames % st->d->samples_in_100ms) {
    /* round up to multiple of samples_in_100ms */
    st->d->audio_data_frames =
        (st->d->audio_data_frames + st->d->samples_in_100ms) -
        (st->d->audio_data_frames % st->d->samples_in_100ms);
  }
  st->d->audio_data = (double*) malloc(st->d->audio_data_frames * st->channels *
                                       sizeof(double));
  CHECK_ERROR(!st->d->audio_data, 0, free_prev_true_peak)
  for (j = 0; j < st->d->audio_data_frames * st->channels; ++j) {
    st->d->audio_data[j] = 0.0;
  }

  errcode = ebur128_init_filter(st);
  CHECK_ERROR(errcode, 0, free_audio_data)

  if (st->d->use_histogram) {
    st->d->block_energy_histogram =
        (unsigned long*) malloc(1000 * sizeof(unsigned long));
    CHECK_ERROR(!st->d->block_energy_histogram, 0, free_filter)
    for (i = 0; i < 1000; ++i) {
      st->d->block_energy_histogram[i] = 0;
    }
  } else {
    st->d->block_energy_histogram = NULL;
  }
  if (st->d->use_histogram) {
    st->d->short_term_block_energy_histogram =
        (unsigned long*) malloc(1000 * sizeof(unsigned long));
    CHECK_ERROR(!st->d->short_term_block_energy_histogram, 0,
                free_block_energy_histogram)
    for (i = 0; i < 1000; ++i) {
      st->d->short_term_block_energy_histogram[i] = 0;
    }
  } else {
    st->d->short_term_block_energy_histogram = NULL;
  }
  STAILQ_INIT(&st->d->block_list);
  st->d->block_list_size = 0;
  st->d->block_list_max = st->d->history / 100;
  STAILQ_INIT(&st->d->short_term_block_list);
  st->d->st_block_list_size = 0;
  st->d->st_block_list_max = st->d->history / 3000;
  st->d->short_term_frame_counter = 0;

  result = ebur128_init_resampler(st);
  CHECK_ERROR(result, 0, free_short_term_block_energy_histogram)

  /* the first block needs 400ms of audio data */
  st->d->needed_frames = st->d->samples_in_100ms * 4;
  /* start at the beginning of the buffer */
  st->d->audio_data_index = 0;

  /* initialize static constants */
  relative_gate_factor = pow(10.0, relative_gate / 10.0);
  minus_twenty_decibels = pow(10.0, -20.0 / 10.0);
  histogram_energy_boundaries[0] = pow(10.0, (-70.0 + 0.691) / 10.0);
  if (st->d->use_histogram) {
    for (i = 0; i < 1000; ++i) {
      histogram_energies[i] =
          pow(10.0, ((double) i / 10.0 - 69.95 + 0.691) / 10.0);
    }
    for (i = 1; i < 1001; ++i) {
      histogram_energy_boundaries[i] =
          pow(10.0, ((double) i / 10.0 - 70.0 + 0.691) / 10.0);
    }
  }

  return st;

free_short_term_block_energy_histogram:
  free(st->d->short_term_block_energy_histogram);
free_block_energy_histogram:
  free(st->d->block_energy_histogram);
free_filter:
  free(st->d->v);
free_audio_data:
  free(st->d->audio_data);
free_prev_true_peak:
  free(st->d->prev_true_peak);
free_true_peak:
  free(st->d->true_peak);
free_prev_sample_peak:
  free(st->d->prev_sample_peak);
free_sample_peak:
  free(st->d->sample_peak);
free_channel_map:
  free(st->d->channel_map);
free_internal:
  free(st->d);
free_state:
  free(st);
exit:
  return NULL;
}